

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::IntStateGetIncrement
          (ChParticleCloud *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ulong uVar6;
  ulong index;
  uint uVar7;
  undefined1 auVar8 [16];
  ChVector<double> *local_f0 [2];
  ChQuaternion<double> q_old;
  double local_c0;
  undefined4 local_b8;
  uint uStack_b4;
  undefined4 uStack_b0;
  uint uStack_ac;
  undefined8 local_a8;
  ChVector<double> local_88;
  ChQuaternion<double> rel_q;
  ChQuaternion<double> q_new;
  
  uVar7 = off_v + 3;
  index = (ulong)off_x;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(this->particles).
                            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->particles).
                            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar6 = (ulong)((int)uVar6 + 1)) {
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_new,index);
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,index);
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Dv,
                        (ulong)(uVar7 - 3));
    iVar3 = (int)index;
    *pSVar5 = dVar1 - dVar2;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_new,
                        (ulong)(iVar3 + 1));
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                        (ulong)(iVar3 + 1));
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Dv,
                        (ulong)(uVar7 - 2));
    *pSVar5 = dVar1 - dVar2;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_new,
                        (ulong)(iVar3 + 2));
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,
                        (ulong)(iVar3 + 2));
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Dv,
                        (ulong)(uVar7 - 1));
    *pSVar5 = dVar1 - dVar2;
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,
               &x->super_ChVectorDynamic<double>,(ulong)(iVar3 + 3),4);
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&q_old,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&local_c0,(type *)0x0);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,
               &x_new->super_ChVectorDynamic<double>,(ulong)(iVar3 + 3),4);
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&q_new,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&local_c0,(type *)0x0);
    auVar8._0_8_ = -q_old.m_data[3];
    auVar8._8_4_ = 0;
    auVar8._12_4_ = 0x80000000;
    uStack_b4 = q_old.m_data[1]._4_4_ ^ 0x80000000;
    uStack_ac = q_old.m_data[2]._4_4_ ^ 0x80000000;
    local_c0 = q_old.m_data[0];
    local_b8 = q_old.m_data[1]._0_4_;
    uStack_b0 = q_old.m_data[2]._0_4_;
    local_a8 = vmovlps_avx(auVar8);
    ChQuaternion<double>::operator%(&rel_q,(ChQuaternion<double> *)&local_c0,&q_new);
    ChQuaternion<double>::Q_to_Rotv(&local_88,&rel_q);
    local_f0[0] = &local_88;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c0,
               &Dv->super_ChVectorDynamic<double>,(ulong)uVar7,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c0,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_f0);
    uVar7 = uVar7 + 6;
    index = (ulong)(iVar3 + 7);
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGetIncrement(const unsigned int off_x,  // offset in x state vector
                                          const ChState& x_new,            // state vector, position part, incremented result
                                          const ChState& x,          // state vector, initial position part
                                          const unsigned int off_v,  // offset in v state vector
                                          ChStateDelta& Dv     // state vector, increment
                                          ) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        // POSITION:
        Dv(off_v + 6 * j) = x_new(off_x + 7 * j) - x(off_x + 7 * j);
        Dv(off_v + 6 * j + 1) = x_new(off_x + 7 * j + 1) - x(off_x + 7 * j + 1);
        Dv(off_v + 6 * j + 2) = x_new(off_x + 7 * j + 2) - x(off_x + 7 * j + 2);

        // ROTATION (quaternions): Dq_loc = q_old^-1 * q_new,
        //  because   q_new = Dq_abs * q_old   = q_old * Dq_loc
        ChQuaternion<> q_old(x.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> q_new(x_new.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> rel_q = q_old.GetConjugate() % q_new;
        Dv.segment(off_v + 6 *j + 3, 3) = rel_q.Q_to_Rotv().eigen();
    }
}